

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O0

size_t __thiscall
webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>::addBuffer
          (Frame<webfront::networking::TCPNetworkingTS> *this,
          span<const_std::byte,_18446744073709551615UL> buffer)

{
  string_view fmt;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t in_stack_00000120;
  span<const_std::byte,_18446744073709551615UL> *in_stack_00000128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__args_1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  undefined **this_01;
  debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [64];
  span<const_std::byte,_18446744073709551615UL> local_10;
  
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff80,(char *)in_RDI);
  this_00 = local_50;
  utils::hexDump<std::span<const_std::byte,_18446744073709551615UL>_>
            (in_stack_00000128,in_stack_00000120);
  this_01 = &PTR_s__workspace_llm4binary_github_lic_001d14a0;
  fmt._M_str = in_stack_ffffffffffffff90;
  fmt._M_len = in_stack_ffffffffffffff88;
  log::debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  debug(this_00,fmt,in_RDI,(srcLoc *)in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  Header::payloadSize((Header *)this_00);
  http::std::span<const_std::byte,_18446744073709551615UL>::size
            ((span<const_std::byte,_18446744073709551615UL> *)0x141479);
  Header::setPayloadSize((Header *)this_01,in_stack_ffffffffffffffa0);
  __args_1 = &in_RDI->field_2;
  http::std::span<const_std::byte,_18446744073709551615UL>::data(&local_10);
  http::std::span<const_std::byte,_18446744073709551615UL>::size
            ((span<const_std::byte,_18446744073709551615UL> *)0x1414b7);
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte_const*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
              *)this_00,(byte **)in_RDI,&__args_1->_M_allocated_capacity);
  sVar1 = http::std::span<const_std::byte,_18446744073709551615UL>::size
                    ((span<const_std::byte,_18446744073709551615UL> *)0x1414dd);
  return sVar1;
}

Assistant:

size_t addBuffer(std::span<const std::byte> buffer) {
        log::debug("frame::addBuffer {}", utils::hexDump(buffer));
        setPayloadSize(payloadSize() + buffer.size());
        buffers.emplace_back(buffer.data(), buffer.size());
        return buffer.size();
    }